

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O3

void rapidjson::internal::Grisu2(double value,char *buffer,int *length,int *K)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  DiyFp DVar4;
  DiyFp DVar5;
  DiyFp local_a0;
  DiyFp local_90;
  undefined1 local_80 [8];
  DiyFp v;
  DiyFp w_m;
  DiyFp w_p;
  
  uVar2 = (uint)((ulong)value >> 0x34) & 0x7ff;
  local_80 = (undefined1  [8])(((ulong)value & 0xfffffffffffff) + 0x10000000000000);
  if (uVar2 == 0) {
    local_80 = (undefined1  [8])((ulong)value & 0xfffffffffffff);
  }
  v.f._0_4_ = -0x432;
  if (uVar2 != 0) {
    v.f._0_4_ = uVar2 - 0x433;
  }
  v.e = 0;
  v._12_4_ = 0;
  w_m.f._0_4_ = 0;
  w_m.e = 0;
  w_m._12_4_ = 0;
  w_p.f._0_4_ = 0;
  DiyFp::NormalizedBoundaries((DiyFp *)local_80,(DiyFp *)&v.e,(DiyFp *)&w_m.e);
  dVar1 = (double)(-0x3d - (int)w_p.f) * 0.30102999566398114 + 347.0;
  iVar3 = (int)((uint)((double)(int)dVar1 < dVar1) + (int)dVar1) >> 3;
  uVar2 = iVar3 + 1;
  *K = 0x15c - (iVar3 * 8 + 8);
  if (uVar2 < 0x57) {
    local_a0.f = *(uint64_t *)
                  (GetCachedPowerByIndex(unsigned_long)::kCachedPowers_F + (ulong)uVar2 * 8);
    local_a0.e = (int)*(short *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_E +
                                (ulong)uVar2 * 2);
    DVar4 = DiyFp::Normalize((DiyFp *)local_80);
    w_p._8_8_ = DVar4.f;
    DVar4 = DiyFp::operator*((DiyFp *)&w_p.e,&local_a0);
    local_90.f = DVar4.f;
    local_90.e = DVar4.e;
    DVar4 = DiyFp::operator*((DiyFp *)&w_m.e,&local_a0);
    DVar5 = DiyFp::operator*((DiyFp *)&v.e,&local_a0);
    w_p._8_8_ = DVar4.f - 1;
    DigitGen(&local_90,(DiyFp *)&w_p.e,(DVar4.f + ~DVar5.f) - 1,buffer,length,K);
    return;
  }
  __assert_fail("index < 87",
                "/workspace/llm4binary/github/license_all_cmakelists_25/PeterlitsZo[P]MessageBookCli/src/val/../../include/rapidjson/internal/diyfp.h"
                ,0xdc,"DiyFp rapidjson::internal::GetCachedPowerByIndex(size_t)");
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
    const DiyFp v(value);
    DiyFp w_m, w_p;
    v.NormalizedBoundaries(&w_m, &w_p);

    const DiyFp c_mk = GetCachedPower(w_p.e, K);
    const DiyFp W = v.Normalize() * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}